

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cpp
# Opt level: O2

void __thiscall
RegJson_CreateBorderRouterFromBorderAgent_Test::TestBody
          (RegJson_CreateBorderRouterFromBorderAgent_Test *this)

{
  Status SVar1;
  char *in_R9;
  char *pcVar2;
  bool bVar3;
  allocator local_6be;
  allocator local_6bd;
  allocator local_6bc;
  allocator local_6bb;
  allocator local_6ba;
  allocator local_6b9;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__12;
  string local_678;
  string local_658;
  Registry reg;
  AssertionResult gtest_ar__2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618 [5];
  string local_5c8;
  string local_5a8;
  allocator local_582;
  allocator local_581;
  string local_580;
  BorderRouterId local_560;
  State local_55c;
  BorderRouterId local_558;
  State local_554;
  BorderRouterId local_550;
  State local_54c;
  BorderRouterId local_548;
  State local_544;
  BorderRouterId local_540;
  State local_53c;
  BorderRouterId local_538;
  State local_534;
  BorderRouterId local_530;
  State local_52c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_528;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_508;
  Network nwk;
  ushort local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  size_type local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [4];
  UnixTime local_378;
  UnixTime local_370;
  UnixTime local_368;
  UnixTime local_360;
  UnixTime local_358;
  UnixTime local_350;
  UnixTime local_348;
  BorderRouter ret_val;
  AssertionResult gtest_ar_;
  undefined1 local_148 [48];
  size_type local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [3];
  uint local_38;
  
  unlink("./tmp/registry_test.json");
  std::__cxx11::string::string
            ((string *)&ret_val,"./tmp/registry_test.json",(allocator *)&gtest_ar_);
  ot::commissioner::persistent_storage::Registry::Registry(&reg,(string *)&ret_val);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Open(&reg);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = SVar1 == kSuccess;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&nwk);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&gtest_ar_,
               (AssertionResult *)"reg.Open() == Registry::Status::kSuccess","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x41,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&ret_val);
    if ((long *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&ret_val,"1.1.1.1",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_52c,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,"net1",&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,anon_var_dwarf_4657bc + 9,&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,anon_var_dwarf_4657bc + 9,&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_348,0);
  pcVar2 = (char *)(ulong)(uint)local_52c;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_52c,(string *)&gtest_ar__2,0x101010101010101,(string *)&gtest_ar__4,
             (string *)&gtest_ar__12,(Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,
             '\0',0,&local_580,local_348,0x33);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&gtest_ar_);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x59,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&ret_val);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_530,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_530,&ret_val);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = SVar1 == kSuccess;
  gtest_ar__2.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5b,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = ret_val.mNetworkId.mId == 0;
  if (ret_val.mNetworkId.mId != 0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)"ret_val.mNetworkId.mId == 0","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5c,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan(&reg,0,&nwk);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)"reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = nwk.mDomainId.mId == 0xffffffff;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)"nwk.mDomainId.mId == EMPTY_ID","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5f,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::string((string *)&ret_val,"1.1.1.2",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_534,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,"net2",&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,anon_var_dwarf_4657bc + 9,&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,"dom2",&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_350,0);
  pcVar2 = (char *)(ulong)(uint)local_534;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&ret_val,2,(ByteArray *)&local_5a8,(string *)&nwk,
             local_534,(string *)&gtest_ar__2,0x202020202020202,(string *)&gtest_ar__4,
             (string *)&gtest_ar__12,(Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,
             '\0',0,&local_580,local_350,0x1033);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&gtest_ar_);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x78,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&ret_val);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_538,1);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_538,&ret_val);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = SVar1 == kSuccess;
  gtest_ar__2.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7b,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = ret_val.mNetworkId.mId == 1;
  if (ret_val.mNetworkId.mId != 1) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)"ret_val.mNetworkId.mId == 1","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7c,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,(string *)local_148,&nwk);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = nwk.mId.mId == 1;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,(AssertionResult *)"nwk.mId.mId == 1"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7f,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = nwk.mDomainId.mId == 0;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)"nwk.mDomainId.mId == 0","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x80,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__2._0_8_ = local_618;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_618[0]._M_local_buf[0] = '\0';
  SVar1 = ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan
                    (&reg,nwk.mXpan,(string *)&gtest_ar__2);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = SVar1 == kSuccess;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x82,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar__2,local_98);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"dom == ba.mDomainName","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x83,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::string((string *)&gtest_ar_,"1.1.1.1",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_53c,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,anon_var_dwarf_4657bc + 9,&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,"vendorName",&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,anon_var_dwarf_4657bc + 9,&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_358,0);
  pcVar2 = (char *)(ulong)(uint)local_53c;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&ret_val,(string *)&gtest_ar_,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_53c,(string *)&gtest_ar__2,0,(string *)&gtest_ar__4,(string *)&gtest_ar__12,
             (Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,'\0',0,&local_580,
             local_358,0x43);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&ret_val);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kError;
  if (SVar1 != kError) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kError","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x9c,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&ret_val);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_540,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_540,&ret_val);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&nwk,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa2,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  bVar3 = (~ret_val.mAgent.mPresentFlags & 3) == 0;
  nwk.mId.mId._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&nwk,
               (AssertionResult *)
               "(val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) == (BorderAgent::kAddrBit | BorderAgent::kPortBit)"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  bVar3 = std::operator==(&ret_val.mAgent.mAddr,"1.1.1.1");
  nwk.mId.mId._0_1_ = bVar3;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&nwk,
               (AssertionResult *)"val.mAgent.mAddr == \"1.1.1.1\"","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa5,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nwk,
                 &ret_val.mAgent.mNetworkName," : ");
  ot::commissioner::utils::Hex<unsigned_long>((string *)&gtest_ar__2,ret_val.mAgent.mExtendedPanId);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nwk,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2);
  ot::commissioner::Console::Write((string *)&gtest_ar_,kDefault);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__2);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    (&reg,ret_val.mAgent.mExtendedPanId,(Network *)&gtest_ar__2);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&nwk,
               (AssertionResult *)
               "reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa8,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  std::__cxx11::string::string((string *)&gtest_ar_,"1.1.1.1",&local_6b9);
  local_508._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&gtest_ar__4,anon_var_dwarf_4657bc + 9,&local_6ba);
  ot::commissioner::BorderAgent::State::State(&local_544,3,2,1,0,0);
  std::__cxx11::string::string((string *)&gtest_ar__12,"net1",&local_6bb);
  std::__cxx11::string::string((string *)&local_678,"vendorName",&local_6bc);
  std::__cxx11::string::string((string *)&local_658,anon_var_dwarf_4657bc + 9,&local_6bd);
  std::__cxx11::string::string((string *)&local_580,"vendorData",&local_6be);
  local_528._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_528._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_5a8,anon_var_dwarf_4657bc + 9,&local_581);
  std::__cxx11::string::string((string *)&local_5c8,anon_var_dwarf_4657bc + 9,&local_582);
  ot::commissioner::UnixTime::UnixTime(&local_360,0);
  pcVar2 = (char *)(ulong)(uint)local_544;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&nwk,(string *)&gtest_ar_,1,(ByteArray *)&local_508,
             (string *)&gtest_ar__4,local_544,(string *)&gtest_ar__12,0x101010101010101,&local_678,
             &local_658,(Timestamp)0x0,0,&local_580,(ByteArray *)&local_528,&local_5a8,'\0',0,
             &local_5c8,local_360,0x47b);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_528);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_508);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&nwk);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc1,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter((BorderRouter *)&gtest_ar_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_548,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    (&reg,local_548,(BorderRouter *)&gtest_ar_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = SVar1 == kSuccess;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc3,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ =
       ret_val.mId.mId ==
       (uint)gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"val.mId.mId == new_val.mId.mId","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc4,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ =
       ret_val.mNetworkId.mId ==
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"val.mNetworkId.mId == new_val.mNetworkId.mId","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc5,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = (bool)((byte)local_38 >> 3 & 1);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__12.success_ == false) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"(new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc6,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = ((local_488 ^ local_148._8_2_) & 7) == 0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,199,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = ((local_488 ^ local_148._8_2_) & 0x18) == 0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,200,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = ((local_488 ^ local_148._8_2_) & 0x60) == 0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"new_val.mAgent.mState.mAvailability == ba.mState.mAvailability",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc9,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = (bool)((byte)local_38 >> 4 & 1);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__12.success_ == false) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xca,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_148 + 0x10),&local_480);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"new_val.mAgent.mNetworkName == ba.mNetworkName","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcb,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = (bool)((byte)local_38 >> 5 & 1);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__12.success_ == false) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0","false","true"
               ,pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcc,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__12.success_ = local_118 == local_460;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"new_val.mAgent.mExtendedPanId == ba.mExtendedPanId","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcd,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = (bool)((byte)local_38 >> 6 & 1);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__12.success_ == false) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xce,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = std::operator==(local_110,local_458);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"new_val.mAgent.mVendorName == ba.mVendorName","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcf,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = (bool)((byte)(local_38 >> 10) & 1);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if ((local_38 >> 10 & 1) == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xd0,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  gtest_ar__12.success_ = std::operator==(&local_c0,local_408);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__12,
               (AssertionResult *)"new_val.mAgent.mVendorData == ba.mVendorData","false","true",
               pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xd1,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)local_678._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_678._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter((BorderRouter *)&gtest_ar_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__2);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  std::__cxx11::string::string((string *)&ret_val,"1.1.1.1",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_54c,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,"net3",&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,"vendorName",&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,anon_var_dwarf_4657bc + 9,&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_368,0);
  pcVar2 = (char *)(ulong)(uint)local_54c;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_54c,(string *)&gtest_ar__2,0x303030303030303,(string *)&gtest_ar__4,
             (string *)&gtest_ar__12,(Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,
             '\0',0,&local_580,local_368,0x73);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&gtest_ar_);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xeb,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&ret_val);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_550,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_550,&ret_val);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = SVar1 == kSuccess;
  gtest_ar__2.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xed,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = ret_val.mNetworkId.mId == 2;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xee,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::string((string *)&ret_val,"1.1.1.1",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_554,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,"net3",&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,"vendorName",&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,"dom2",&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_370,0);
  pcVar2 = (char *)(ulong)(uint)local_554;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_554,(string *)&gtest_ar__2,0x303030303030303,(string *)&gtest_ar__4,
             (string *)&gtest_ar__12,(Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,
             '\0',0,&local_580,local_370,0x1073);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&gtest_ar_);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x108,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&ret_val);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_558,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_558,&ret_val);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = SVar1 == kSuccess;
  gtest_ar__2.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10a,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = ret_val.mNetworkId.mId == 2;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10b,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,(string *)local_148,&nwk);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10d,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = nwk.mDomainId.mId == 0;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)"nwk.mDomainId.mId == 0","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::string((string *)&ret_val,"1.1.1.1",(allocator *)&local_508);
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&nwk,anon_var_dwarf_4657bc + 9,(allocator *)&local_528);
  ot::commissioner::BorderAgent::State::State(&local_55c,0);
  std::__cxx11::string::string((string *)&gtest_ar__2,"net3",&local_6b9);
  std::__cxx11::string::string((string *)&gtest_ar__4,"vendorName",&local_6ba);
  std::__cxx11::string::string((string *)&gtest_ar__12,anon_var_dwarf_4657bc + 9,&local_6bb);
  std::__cxx11::string::string((string *)&local_678,anon_var_dwarf_4657bc + 9,&local_6bc);
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_658,"dom1",&local_6bd);
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_4657bc + 9,&local_6be);
  ot::commissioner::UnixTime::UnixTime(&local_378,0);
  pcVar2 = (char *)(ulong)(uint)local_55c;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_55c,(string *)&gtest_ar__2,0x303030303030303,(string *)&gtest_ar__4,
             (string *)&gtest_ar__12,(Timestamp)0x0,0,&local_678,(ByteArray *)&local_5c8,&local_658,
             '\0',0,&local_580,local_378,0x1073);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&gtest_ar__12);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&nwk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8);
  std::__cxx11::string::~string((string *)&ret_val);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&gtest_ar_);
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x128,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&ret_val);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&nwk.mName);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_560,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_560,&ret_val);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = SVar1 == kSuccess;
  gtest_ar__2.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12a,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = ret_val.mNetworkId.mId == 2;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&gtest_ar__2,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,299,(char *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&nwk);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,(string *)local_148,&nwk);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12d,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = nwk.mDomainId.mId == 1;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__4,
               (AssertionResult *)"nwk.mDomainId.mId == 1","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&ret_val);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::Registry::Close(&reg);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = SVar1 == kSuccess;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&nwk);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&gtest_ar_,
               (AssertionResult *)"reg.Close() == Registry::Status::kSuccess","false","true",pcVar2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x131,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&ret_val);
    if ((long *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(nwk.mDomainId.mId,nwk.mId.mId) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::Registry::~Registry(&reg);
  return;
}

Assistant:

TEST(RegJson, CreateBorderRouterFromBorderAgent)
{
    unlink(json_path);
    Registry reg(json_path);

    EXPECT_TRUE(reg.Open() == Registry::Status::kSuccess);

    // Create BorderRouter with network
    {
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net1",
                       0x0101010101010101,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 0);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == EMPTY_ID);
    }

    // Create BorderRouter with network and domain
    {
        BorderAgent ba{"1.1.1.2",
                       2,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net2",
                       0x0202020202020202,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);

        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 1);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mId.mId == 1);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
        std::string dom;
        EXPECT_TRUE(reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess);
        EXPECT_TRUE(dom == ba.mDomainName);
    }

    // Fail to create BorderRouter without network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "",
                       0,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kError);
    }
    // Update BorderRouter fields
    {
        // Check the BorderRouter present
        BorderRouter val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess);
        EXPECT_TRUE((val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) ==
                    (BorderAgent::kAddrBit | BorderAgent::kPortBit));
        EXPECT_TRUE(val.mAgent.mAddr == "1.1.1.1");
        INFO(val.mAgent.mNetworkName + " : " + utils::Hex(val.mAgent.mExtendedPanId));
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess);
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{BorderAgent::State::ConnectionMode::kVendorSpecific,
                                          BorderAgent::State::ThreadInterfaceStatus::kActive,
                                          BorderAgent::State::Availability::kHigh, 0, 0},
                       "net1",
                       0x0101010101010101,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "vendorData",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kStateBit |
                           BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit |
                           BorderAgent::kVendorDataBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(val.mId.mId == new_val.mId.mId);
        EXPECT_TRUE(val.mNetworkId.mId == new_val.mNetworkId.mId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode);
        EXPECT_TRUE(new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus);
        EXPECT_TRUE(new_val.mAgent.mState.mAvailability == ba.mState.mAvailability);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mNetworkName == ba.mNetworkName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mExtendedPanId == ba.mExtendedPanId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorName == ba.mVendorName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorData == ba.mVendorData);
    }

    // Update BorderRouter - switch network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
    }

    // Update BorderRouter - add network into domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
    }

    // Update BorderRouter - move network into another domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom1", // New domain, will have id == 1
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 1);
    }

    EXPECT_TRUE(reg.Close() == Registry::Status::kSuccess);
}